

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

bool __thiscall
TgBot::Api::pinChatMessage(Api *this,int64_t chatId,int32_t messageId,bool disableNotification)

{
  type_conflict tVar1;
  bool local_ca [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  allocator local_91;
  string local_90;
  ptree local_70;
  undefined1 local_38 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  bool disableNotification_local;
  int64_t iStack_18;
  int32_t messageId_local;
  int64_t chatId_local;
  Api *this_local;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = disableNotification;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = messageId;
  iStack_18 = chatId;
  chatId_local = (int64_t)this;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_38);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_38,3);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_38,
             (char (*) [8])0x4758d6,&stack0xffffffffffffffe8);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[11],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_38,
             (char (*) [11])0x473ff9,
             (int *)((long)&args.
                            super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_38,
               (char (*) [21])"disable_notification",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"pinChatMessage",&local_91);
  sendRequest(&local_70,this,&local_90,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_38);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_c8,"",0x2e);
  local_ca[0] = false;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(&local_70,&local_c8,local_ca);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_c8);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_38);
  return tVar1;
}

Assistant:

bool Api::pinChatMessage(int64_t chatId, int32_t messageId, bool disableNotification) const {
    vector<HttpReqArg> args;
    args.reserve(3);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("message_id", messageId);
    if (disableNotification) {
        args.emplace_back("disable_notification", disableNotification);
    }
    return sendRequest("pinChatMessage", args).get<bool>("", false);
}